

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLReader::XMLReader
          (XMLReader *this,XMLCh *pubId,XMLCh *sysId,BinInputStream *streamToAdopt,
          XMLCh *encodingStr,RefFrom from,Types type,Sources source,bool throwAtEnd,
          bool calculateSrcOfs,XMLSize_t lowWaterMark,XMLVersion version,MemoryManager *manager)

{
  short *psVar1;
  undefined1 uVar2;
  int iVar3;
  Encodings EVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLTranscoder *pXVar6;
  TranscodingException *this_00;
  XMLByte *pXVar7;
  size_t sVar8;
  XMLSize_t XVar9;
  Codes failReason;
  Codes local_4c;
  BinInputStream *local_48;
  ArrayJanitor<char16_t> local_40;
  XMLCh *pXVar5;
  
  pXVar5 = (XMLCh *)0x0;
  this->fCharIndex = 0;
  this->fCharsAvail = 0;
  this->fCurCol = 1;
  this->fCurLine = 1;
  this->fEncoding = UTF_8;
  this->fEncodingStr = (XMLCh *)0x0;
  this->fForcedEncoding = true;
  this->fNoMore = false;
  local_48 = streamToAdopt;
  if (pubId != (XMLCh *)0x0) {
    sVar8 = 0;
    do {
      psVar1 = (short *)((long)pubId + sVar8);
      sVar8 = sVar8 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,sVar8);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memcpy(pXVar5,pubId,sVar8);
  }
  this->fPublicId = pXVar5;
  pXVar5 = (XMLCh *)0x0;
  this->fRawBufIndex = 0;
  this->fRawBytesAvail = 0;
  this->fLowWaterMark = lowWaterMark;
  this->fReaderNum = 0xffffffff;
  this->fRefFrom = from;
  this->fSentTrailingSpace = false;
  this->fSource = source;
  this->fSrcOfsBase = 0;
  this->fSrcOfsSupported = false;
  this->fCalculateSrcOfs = calculateSrcOfs;
  if (sysId != (XMLCh *)0x0) {
    sVar8 = 0;
    do {
      psVar1 = (short *)((long)sysId + sVar8);
      sVar8 = sVar8 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,sVar8);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    memcpy(pXVar5,sysId,sVar8);
  }
  this->fSystemId = pXVar5;
  this->fStream = local_48;
  this->fSwapped = false;
  this->fThrowAtEnd = throwAtEnd;
  this->fTranscoder = (XMLTranscoder *)0x0;
  this->fType = type;
  this->fMemoryManager = manager;
  this->fXMLVersion = version;
  pXVar7 = &XMLChar1_0::fgCharCharsTable1_0;
  uVar2 = XMLChar1_0::enableNEL;
  if (version == XMLV1_1) {
    pXVar7 = &XMLChar1_1::fgCharCharsTable1_1;
    uVar2 = true;
  }
  this->fNEL = (bool)uVar2;
  this->fgCharCharsTable = pXVar7;
  refreshRawBuffer(this);
  if (encodingStr == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    sVar8 = 0;
    do {
      psVar1 = (short *)((long)encodingStr + sVar8);
      sVar8 = sVar8 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar8);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
    memcpy(pXVar5,encodingStr,sVar8);
  }
  this->fEncodingStr = pXVar5;
  XMLString::upperCaseASCII(pXVar5);
  iVar3 = (*XMLPlatformUtils::fgTransService->_vptr_XMLTransService[6])();
  this->fSrcOfsSupported = SUB41(iVar3,0);
  EVar4 = XMLRecognizer::encodingForName(this->fEncodingStr);
  this->fEncoding = EVar4;
  if (EVar4 - UCS_4B < 2) {
    if (this->fRawBytesAvail < 5) goto LAB_002c4750;
    if ((this->fRawByteBuf[3] != 0xff ||
         (this->fRawByteBuf[2] != 0xfe ||
         (this->fRawByteBuf[0] != '\0' || this->fRawByteBuf[1] != '\0'))) &&
       (((this->fRawByteBuf[1] != 0xfe || this->fRawByteBuf[0] != 0xff) ||
        this->fRawByteBuf[2] != '\0') || this->fRawByteBuf[3] != '\0')) goto LAB_002c4750;
    XVar9 = this->fRawBufIndex + 4;
  }
  else if (EVar4 - UTF_16B < 2) {
    if (this->fRawBytesAvail < 2) goto LAB_002c4750;
    if ((*(short *)(this->fRawByteBuf + this->fRawBufIndex) != -2) &&
       (*(short *)(this->fRawByteBuf + this->fRawBufIndex) != -0x101)) goto LAB_002c4750;
    XVar9 = this->fRawBufIndex + 2;
  }
  else {
    if (((EVar4 != UTF_8) || (this->fRawBytesAvail < 4)) ||
       (iVar3 = XMLString::compareNString
                          ((char *)this->fRawByteBuf,(char *)&XMLRecognizer::fgUTF8BOM,3),
       iVar3 != 0)) goto LAB_002c4750;
    XVar9 = this->fRawBufIndex + 3;
  }
  this->fRawBufIndex = XVar9;
LAB_002c4750:
  checkForSwapped(this);
  if (this->fEncoding == OtherEncoding) {
    pXVar6 = XMLTransService::makeNewTranscoderFor
                       (XMLPlatformUtils::fgTransService,this->fEncodingStr,&local_4c,0x4000,
                        this->fMemoryManager);
  }
  else {
    pXVar6 = XMLTransService::makeNewTranscoderFor
                       (XMLPlatformUtils::fgTransService,this->fEncoding,&local_4c,0x4000,
                        this->fMemoryManager);
  }
  this->fTranscoder = pXVar6;
  if (pXVar6 == (XMLTranscoder *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fSystemId);
    ArrayJanitor<char16_t>::ArrayJanitor(&local_40,this->fEncodingStr,this->fMemoryManager);
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
               ,0x15b,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
  }
  if ((this->fType == Type_PE) && (this->fRefFrom == RefFrom_NonLiteral)) {
    this->fCharSizeBuf[this->fCharsAvail] = '\0';
    XVar9 = this->fCharsAvail;
    this->fCharOfsBuf[XVar9] = 0;
    this->fCharsAvail = XVar9 + 1;
    this->fCharBuf[XVar9] = L' ';
  }
  return;
}

Assistant:

XMLReader::XMLReader(const  XMLCh* const          pubId
                    , const XMLCh* const          sysId
                    ,       BinInputStream* const streamToAdopt
                    , const XMLCh* const          encodingStr
                    , const RefFrom               from
                    , const Types                 type
                    , const Sources               source
                    , const bool                  throwAtEnd
                    , const bool                  calculateSrcOfs
                    ,       XMLSize_t             lowWaterMark
                    , const XMLVersion            version
                    ,       MemoryManager* const  manager) :
    fCharIndex(0)
    , fCharsAvail(0)
    , fCurCol(1)
    , fCurLine(1)
    , fEncoding(XMLRecognizer::UTF_8)
    , fEncodingStr(0)
    , fForcedEncoding(true)
    , fNoMore(false)
    , fPublicId(XMLString::replicate(pubId, manager))
    , fRawBufIndex(0)
    , fRawBytesAvail(0)
    , fLowWaterMark (lowWaterMark)
    , fReaderNum(0xFFFFFFFF)
    , fRefFrom(from)
    , fSentTrailingSpace(false)
    , fSource(source)
    , fSrcOfsBase(0)
    , fSrcOfsSupported(false)
    , fCalculateSrcOfs(calculateSrcOfs)
    , fSystemId(XMLString::replicate(sysId, manager))
    , fStream(streamToAdopt)
    , fSwapped(false)
    , fThrowAtEnd(throwAtEnd)
    , fTranscoder(0)
    , fType(type)
    , fMemoryManager(manager)
{
    setXMLVersion(version);

    try
    {
        // Do an initial load of raw bytes
        refreshRawBuffer();
    }
    catch (const XMLPlatformUtilsException&)
    {
        cleanup();
        throw;
    }

    // Copy the encoding string to our member
    fEncodingStr = XMLString::replicate(encodingStr, fMemoryManager);
    XMLString::upperCaseASCII(fEncodingStr);

    // Ask the transcoding service if it supports src offset info
    fSrcOfsSupported = XMLPlatformUtils::fgTransService->supportsSrcOfs();

    //
    //  Map the passed encoding name to one of our enums. If it does not
    //  match one of the intrinsic encodings, it will come back 'other',
    //  which tells us to create a transcoder based reader.
    //
    fEncoding = XMLRecognizer::encodingForName(fEncodingStr);

    //  test the presence of the BOM and remove it from the source
    switch(fEncoding)
    {
        case XMLRecognizer::UCS_4B :
        case XMLRecognizer::UCS_4L :
        {
            if (fRawBytesAvail > 4 &&
                (((fRawByteBuf[0] == 0x00) && (fRawByteBuf[1] == 0x00) && (fRawByteBuf[2] == 0xFE) && (fRawByteBuf[3] == 0xFF)) ||
                 ((fRawByteBuf[0] == 0xFF) && (fRawByteBuf[1] == 0xFE) && (fRawByteBuf[2] == 0x00) && (fRawByteBuf[3] == 0x00)))  )
            {
                fRawBufIndex += 4;
            }
            break;
        }
        case XMLRecognizer::UTF_8 :
        {
            // Look at the raw buffer as short chars
            const char* asChars = (const char*)fRawByteBuf;

            if (fRawBytesAvail > XMLRecognizer::fgUTF8BOMLen &&
                XMLString::compareNString(  asChars
                                            , XMLRecognizer::fgUTF8BOM
                                            , XMLRecognizer::fgUTF8BOMLen) == 0)
            {
                fRawBufIndex += XMLRecognizer::fgUTF8BOMLen;
            }
            break;
        }
        case XMLRecognizer::UTF_16B :
        case XMLRecognizer::UTF_16L :
        {
            if (fRawBytesAvail < 2)
                break;

            const UTF16Ch* asUTF16 = reinterpret_cast<const UTF16Ch*>(&fRawByteBuf[fRawBufIndex]);
            if ((*asUTF16 == chUnicodeMarker) || (*asUTF16 == chSwappedUnicodeMarker))
            {
                fRawBufIndex += sizeof(UTF16Ch);
            }
            break;
        }
        case XMLRecognizer::EBCDIC:
        case XMLRecognizer::US_ASCII:
        case XMLRecognizer::XERCES_XMLCH:
        case XMLRecognizer::OtherEncoding:
        case XMLRecognizer::Encodings_Count:
        {
            // silence warning about enumeration not being used
            break;
        }
    }

    // Check whether the fSwapped flag should be set or not
    checkForSwapped();

    //
    //  Create a transcoder for the encoding. Since the encoding has been
    //  forced, this will be the one we will use, period.
    //
    XMLTransService::Codes failReason;
    if (fEncoding == XMLRecognizer::OtherEncoding)
    {
        //
        //  fEncodingStr not  pre-recognized, use it
        //  directly for transcoder
        //
        fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
        (
            fEncodingStr
            , failReason
            , kCharBufSize
            , fMemoryManager
        );
    }
     else
    {
        //
        //  Use the recognized fEncoding to create the transcoder
        //
        fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
        (
            fEncoding
            , failReason
            , kCharBufSize
            , fMemoryManager
        );

    }

    if (!fTranscoder)
    {
        // We are about to throw which means the d-tor won't be called.
        // Clean up some memory.
        //
        fMemoryManager->deallocate(fPublicId);
        fMemoryManager->deallocate(fSystemId);
        ArrayJanitor<XMLCh> jan (fEncodingStr, fMemoryManager);

        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , fEncodingStr
            , fMemoryManager
        );
    }

    //
    //  Note that, unlike above, we do not do an initial decode of the
    //  first line. We take the caller's word that the encoding is correct
    //  and just assume that the first bulk decode (kicked off by the first
    //  get of a character) will work.
    //
    //  So we do here the slipping in of the leading space if required.
    //
    if ((fType == Type_PE) && (fRefFrom == RefFrom_NonLiteral))
    {
        // This represents no data from the source
        fCharSizeBuf[fCharsAvail] = 0;
        fCharOfsBuf[fCharsAvail] = 0;
        fCharBuf[fCharsAvail++] = chSpace;
    }
}